

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O3

void Imf_2_5::anon_unknown_1::initialize
               (Header *header,Box2i *displayWindow,Box2i *dataWindow,float pixelAspectRatio,
               V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder,
               Compression compression)

{
  ArgExc *this;
  stringstream _iex_throw_s;
  undefined1 local_1b8 [8];
  V2f VStack_1b0;
  undefined1 auStack_1a8 [16];
  undefined1 local_198 [16];
  undefined8 local_188;
  
  auStack_1a8._8_8_ = auStack_1a8._0_8_;
  Attribute::Attribute((Attribute *)local_1b8);
  VStack_1b0.x = (float)(displayWindow->min).x;
  VStack_1b0.y = (float)(displayWindow->min).y;
  auStack_1a8._0_8_ = displayWindow->max;
  local_1b8 = (undefined1  [8])&PTR__Attribute_031e70d0;
  Header::insert(header,"displayWindow",(Attribute *)local_1b8);
  Attribute::~Attribute((Attribute *)local_1b8);
  Attribute::Attribute((Attribute *)local_1b8);
  VStack_1b0.x = (float)(dataWindow->min).x;
  VStack_1b0.y = (float)(dataWindow->min).y;
  local_1b8 = (undefined1  [8])&PTR__Attribute_031e70d0;
  auStack_1a8._0_4_ = (dataWindow->max).x;
  auStack_1a8._4_4_ = (dataWindow->max).y;
  Header::insert(header,"dataWindow",(Attribute *)local_1b8);
  Attribute::~Attribute((Attribute *)local_1b8);
  if ((int)ABS(pixelAspectRatio) - 0x800000U < 0x7f000000 && -1 < (int)pixelAspectRatio) {
    Attribute::Attribute((Attribute *)local_1b8);
    VStack_1b0.x = pixelAspectRatio;
    local_1b8 = (undefined1  [8])&PTR__Attribute_031e5fd0;
    Header::insert(header,"pixelAspectRatio",(Attribute *)local_1b8);
    Attribute::~Attribute((Attribute *)local_1b8);
    Attribute::Attribute((Attribute *)local_1b8);
    VStack_1b0 = *screenWindowCenter;
    local_1b8 = (undefined1  [8])&PTR__Attribute_031e7130;
    Header::insert(header,"screenWindowCenter",(Attribute *)local_1b8);
    Attribute::~Attribute((Attribute *)local_1b8);
    Attribute::Attribute((Attribute *)local_1b8);
    VStack_1b0.x = screenWindowWidth;
    local_1b8 = (undefined1  [8])&PTR__Attribute_031e5fd0;
    Header::insert(header,"screenWindowWidth",(Attribute *)local_1b8);
    Attribute::~Attribute((Attribute *)local_1b8);
    Attribute::Attribute((Attribute *)local_1b8);
    VStack_1b0.x = (float)lineOrder;
    local_1b8 = (undefined1  [8])&PTR__Attribute_031e7190;
    Header::insert(header,"lineOrder",(Attribute *)local_1b8);
    Attribute::~Attribute((Attribute *)local_1b8);
    Attribute::Attribute((Attribute *)local_1b8);
    VStack_1b0.x = (float)compression;
    local_1b8 = (undefined1  [8])&PTR__Attribute_031e71f0;
    Header::insert(header,"compression",(Attribute *)local_1b8);
    Attribute::~Attribute((Attribute *)local_1b8);
    local_188 = 0;
    local_198 = (undefined1  [16])0x0;
    auStack_1a8 = (undefined1  [16])0x0;
    _local_1b8 = (undefined1  [16])0x0;
    Attribute::Attribute((Attribute *)local_1b8);
    local_1b8 = (undefined1  [8])&PTR__TypedAttribute_031e7250;
    auStack_1a8._0_8_ = auStack_1a8._4_8_ << 0x20;
    auStack_1a8._8_8_ = 0;
    local_198._8_8_ = auStack_1a8;
    local_198._0_8_ = auStack_1a8;
    local_188 = 0;
    Header::insert(header,"channels",(Attribute *)local_1b8);
    local_1b8 = (undefined1  [8])&PTR__TypedAttribute_031e7250;
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
                 *)&VStack_1b0);
    Attribute::~Attribute((Attribute *)local_1b8);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,"Invalid pixel aspect ratio",0x1a);
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this,(stringstream *)local_1b8);
  __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
initialize (Header &header,
	    const Box2i &displayWindow,
	    const Box2i &dataWindow,
	    float pixelAspectRatio,
	    const V2f &screenWindowCenter,
	    float screenWindowWidth,
	    LineOrder lineOrder,
	    Compression compression)
{
    header.insert ("displayWindow", Box2iAttribute (displayWindow));
    header.insert ("dataWindow", Box2iAttribute (dataWindow));
    if ( !std::isnormal (pixelAspectRatio) || pixelAspectRatio < 0.f)
        THROW (IEX_NAMESPACE::ArgExc, "Invalid pixel aspect ratio");
    header.insert ("pixelAspectRatio", FloatAttribute (pixelAspectRatio));
    header.insert ("screenWindowCenter", V2fAttribute (screenWindowCenter));
    header.insert ("screenWindowWidth", FloatAttribute (screenWindowWidth));
    header.insert ("lineOrder", LineOrderAttribute (lineOrder));
    header.insert ("compression", CompressionAttribute (compression));
    header.insert ("channels", ChannelListAttribute ());
}